

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_dimensional_inverse_fast_fourier_transform.cc
# Opt level: O0

bool __thiscall
sptk::TwoDimensionalInverseFastFourierTransform::Run
          (TwoDimensionalInverseFastFourierTransform *this,Matrix *real_part_input,
          Matrix *imag_part_input,Matrix *real_part_output,Matrix *imag_part_output,Buffer *buffer)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  double *pdVar7;
  iterator this_00;
  iterator real_part_input_00;
  reference pvVar8;
  reference pvVar9;
  Matrix *in_RCX;
  Matrix *in_RDX;
  Matrix *in_RSI;
  long in_RDI;
  Matrix *in_R8;
  long in_R9;
  int i_2;
  int j_1;
  int i_1;
  int j;
  int i;
  double *y;
  double *x;
  size_t size;
  undefined4 in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  Matrix *in_stack_fffffffffffffeb0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffeb8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffec0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffec8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffed0;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  int iVar10;
  undefined4 in_stack_ffffffffffffff24;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff28;
  vector<double,_std::allocator<double>_> *imag_part_input_00;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff30;
  InverseFastFourierTransform *in_stack_ffffffffffffff38;
  int local_98;
  int local_94;
  
  if ((((((*(byte *)(in_RDI + 0x50) & 1) != 0) &&
        (iVar2 = Matrix::GetNumRow(in_RSI), iVar2 == *(int *)(in_RDI + 8))) &&
       (iVar2 = Matrix::GetNumColumn(in_RSI), iVar2 == *(int *)(in_RDI + 0xc))) &&
      ((iVar2 = Matrix::GetNumRow(in_RDX), iVar2 == *(int *)(in_RDI + 8) &&
       (iVar2 = Matrix::GetNumColumn(in_RDX), iVar2 == *(int *)(in_RDI + 0xc))))) &&
     ((in_RCX != (Matrix *)0x0 && ((in_R8 != (Matrix *)0x0 && (in_R9 != 0)))))) {
    sVar3 = (size_type)*(int *)(in_RDI + 0x10);
    sVar4 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_R9 + 8));
    if (sVar4 != sVar3) {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffed0._M_current,
                 (size_type)in_stack_fffffffffffffec8._M_current);
    }
    sVar4 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_R9 + 0x20));
    if (sVar4 != sVar3) {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffed0._M_current,
                 (size_type)in_stack_fffffffffffffec8._M_current);
    }
    sVar4 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)(in_R9 + 0x38));
    if (sVar4 != sVar3) {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::resize((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)in_stack_fffffffffffffed0._M_current,
               (size_type)in_stack_fffffffffffffec8._M_current);
    }
    sVar4 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)(in_R9 + 0x50));
    if (sVar4 != sVar3) {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::resize((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)in_stack_fffffffffffffed0._M_current,
               (size_type)in_stack_fffffffffffffec8._M_current);
    }
    sVar4 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)(in_R9 + 0x68));
    if (sVar4 != sVar3) {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::resize((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)in_stack_fffffffffffffed0._M_current,
               (size_type)in_stack_fffffffffffffec8._M_current);
    }
    sVar4 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)(in_R9 + 0x80));
    if (sVar4 != sVar3) {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::resize((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)in_stack_fffffffffffffed0._M_current,
               (size_type)in_stack_fffffffffffffec8._M_current);
    }
    iVar2 = Matrix::GetNumRow(in_RCX);
    if ((iVar2 != *(int *)(in_RDI + 0x10)) ||
       (iVar2 = Matrix::GetNumColumn(in_RCX), iVar2 != *(int *)(in_RDI + 0x10))) {
      Matrix::Resize((Matrix *)in_stack_fffffffffffffed0._M_current,
                     (int)((ulong)in_stack_fffffffffffffec8._M_current >> 0x20),
                     (int)in_stack_fffffffffffffec8._M_current);
    }
    iVar2 = Matrix::GetNumRow(in_R8);
    if ((iVar2 != *(int *)(in_RDI + 0x10)) ||
       (iVar2 = Matrix::GetNumColumn(in_R8), iVar2 != *(int *)(in_RDI + 0x10))) {
      Matrix::Resize((Matrix *)in_stack_fffffffffffffed0._M_current,
                     (int)((ulong)in_stack_fffffffffffffec8._M_current >> 0x20),
                     (int)in_stack_fffffffffffffec8._M_current);
    }
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_R9 + 8),0);
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_R9 + 0x20),0);
    std::vector<double,_std::allocator<double>_>::begin
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::operator+
              ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
               in_stack_fffffffffffffeb8._M_current,(difference_type)in_stack_fffffffffffffeb0);
    std::vector<double,_std::allocator<double>_>::end
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    std::
    fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
               (double *)in_stack_fffffffffffffeb0);
    std::vector<double,_std::allocator<double>_>::begin
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::operator+
              ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
               in_stack_fffffffffffffeb8._M_current,(difference_type)in_stack_fffffffffffffeb0);
    std::vector<double,_std::allocator<double>_>::end
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    std::
    fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
               (double *)in_stack_fffffffffffffeb0);
    local_94 = 0;
    while( true ) {
      if (*(int *)(in_RDI + 0xc) <= local_94) {
        std::vector<double,_std::allocator<double>_>::begin
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
        __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
        operator+((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                  in_stack_fffffffffffffeb8._M_current,(difference_type)in_stack_fffffffffffffeb0);
        std::vector<double,_std::allocator<double>_>::end
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
        std::
        fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                  (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                   (double *)in_stack_fffffffffffffeb0);
        this_00 = std::vector<double,_std::allocator<double>_>::begin
                            ((vector<double,_std::allocator<double>_> *)
                             CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
        __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
        operator+((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                  in_stack_fffffffffffffeb8._M_current,(difference_type)in_stack_fffffffffffffeb0);
        real_part_input_00 =
             std::vector<double,_std::allocator<double>_>::end
                       ((vector<double,_std::allocator<double>_> *)
                        CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
        imag_part_input_00 = (vector<double,_std::allocator<double>_> *)0x0;
        std::
        fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                  (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                   (double *)in_stack_fffffffffffffeb0);
        iVar2 = 0;
        while( true ) {
          if (*(int *)(in_RDI + 0x10) <= iVar2) {
            for (iVar2 = 0; iVar2 < *(int *)(in_RDI + 0x10); iVar2 = iVar2 + 1) {
              std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            *)(in_R9 + 0x68),(long)iVar2);
              std::vector<double,_std::allocator<double>_>::begin
                        ((vector<double,_std::allocator<double>_> *)
                         CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
              std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            *)(in_R9 + 0x68),(long)iVar2);
              std::vector<double,_std::allocator<double>_>::end
                        ((vector<double,_std::allocator<double>_> *)
                         CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
              Matrix::operator[](in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
              std::
              copy<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double*>
                        (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                         in_stack_fffffffffffffec0._M_current);
              std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            *)(in_R9 + 0x80),(long)iVar2);
              std::vector<double,_std::allocator<double>_>::begin
                        ((vector<double,_std::allocator<double>_> *)
                         CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
              std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            *)(in_R9 + 0x80),(long)iVar2);
              std::vector<double,_std::allocator<double>_>::end
                        ((vector<double,_std::allocator<double>_> *)
                         CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
              Matrix::operator[](in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
              std::
              copy<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double*>
                        (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                         in_stack_fffffffffffffec0._M_current);
            }
            return true;
          }
          for (iVar10 = 0; iVar10 < *(int *)(in_RDI + 0xc); iVar10 = iVar10 + 1) {
            pvVar8 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   *)(in_R9 + 0x38),(long)iVar10);
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](pvVar8,(long)iVar2);
            pvVar5[iVar10] = *pvVar9;
            pvVar8 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   *)(in_R9 + 0x50),(long)iVar10);
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](pvVar8,(long)iVar2);
            pvVar6[iVar10] = *pvVar9;
          }
          in_stack_fffffffffffffeb0 = (Matrix *)(in_RDI + 0x18);
          in_stack_fffffffffffffec0._M_current = (double *)(in_R9 + 0x20);
          in_stack_fffffffffffffec8._M_current =
               (double *)
               std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)(in_R9 + 0x68),(long)iVar2);
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        *)(in_R9 + 0x80),(long)iVar2);
          bVar1 = InverseFastFourierTransform::Run
                            ((InverseFastFourierTransform *)this_00._M_current,
                             (vector<double,_std::allocator<double>_> *)
                             real_part_input_00._M_current,imag_part_input_00,
                             (vector<double,_std::allocator<double>_> *)CONCAT44(iVar2,iVar10),
                             (vector<double,_std::allocator<double>_> *)
                             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
          if (!bVar1) break;
          iVar2 = iVar2 + 1;
        }
        return false;
      }
      for (local_98 = 0; local_98 < *(int *)(in_RDI + 8); local_98 = local_98 + 1) {
        pdVar7 = Matrix::operator[](in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
        pvVar5[local_98] = pdVar7[local_94];
        pdVar7 = Matrix::operator[](in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
        pvVar6[local_98] = pdVar7[local_94];
      }
      in_stack_fffffffffffffed0._M_current = (double *)(in_RDI + 0x18);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)(in_R9 + 0x38),(long)local_94);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)(in_R9 + 0x50),(long)local_94);
      bVar1 = InverseFastFourierTransform::Run
                        (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                         in_stack_ffffffffffffff28,
                         (vector<double,_std::allocator<double>_> *)
                         CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                         (vector<double,_std::allocator<double>_> *)
                         CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      if (!bVar1) break;
      local_94 = local_94 + 1;
    }
    return false;
  }
  return false;
}

Assistant:

bool TwoDimensionalInverseFastFourierTransform::Run(
    const Matrix& real_part_input, const Matrix& imag_part_input,
    Matrix* real_part_output, Matrix* imag_part_output,
    TwoDimensionalInverseFastFourierTransform::Buffer* buffer) const {
  // Check inputs.
  if (!is_valid_ || real_part_input.GetNumRow() != num_row_ ||
      real_part_input.GetNumColumn() != num_column_ ||
      imag_part_input.GetNumRow() != num_row_ ||
      imag_part_input.GetNumColumn() != num_column_ ||
      NULL == real_part_output || NULL == imag_part_output || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  {
    const std::size_t size(static_cast<std::size_t>(fft_length_));
    if (buffer->real_part_input_.size() != size) {
      buffer->real_part_input_.resize(size);
    }
    if (buffer->imag_part_input_.size() != size) {
      buffer->imag_part_input_.resize(size);
    }
    if (buffer->first_real_part_outputs_.size() != size) {
      buffer->first_real_part_outputs_.resize(size);
    }
    if (buffer->first_imag_part_outputs_.size() != size) {
      buffer->first_imag_part_outputs_.resize(size);
    }
    if (buffer->second_real_part_outputs_.size() != size) {
      buffer->second_real_part_outputs_.resize(size);
    }
    if (buffer->second_imag_part_outputs_.size() != size) {
      buffer->second_imag_part_outputs_.resize(size);
    }
    if (real_part_output->GetNumRow() != fft_length_ ||
        real_part_output->GetNumColumn() != fft_length_) {
      real_part_output->Resize(fft_length_, fft_length_);
    }
    if (imag_part_output->GetNumRow() != fft_length_ ||
        imag_part_output->GetNumColumn() != fft_length_) {
      imag_part_output->Resize(fft_length_, fft_length_);
    }
  }

  double* x(&buffer->real_part_input_[0]);
  double* y(&buffer->imag_part_input_[0]);

  // First stage.
  std::fill(buffer->real_part_input_.begin() + num_row_,
            buffer->real_part_input_.end(), 0.0);
  std::fill(buffer->imag_part_input_.begin() + num_row_,
            buffer->imag_part_input_.end(), 0.0);
  for (int i(0); i < num_column_; ++i) {
    for (int j(0); j < num_row_; ++j) {
      x[j] = real_part_input[j][i];
      y[j] = imag_part_input[j][i];
    }
    if (!inverse_fast_fourier_transform_.Run(
            buffer->real_part_input_, buffer->imag_part_input_,
            &buffer->first_real_part_outputs_[i],
            &buffer->first_imag_part_outputs_[i])) {
      return false;
    }
  }

  // Second stage.
  std::fill(buffer->real_part_input_.begin() + num_column_,
            buffer->real_part_input_.end(), 0.0);
  std::fill(buffer->imag_part_input_.begin() + num_column_,
            buffer->imag_part_input_.end(), 0.0);
  for (int i(0); i < fft_length_; ++i) {
    for (int j(0); j < num_column_; ++j) {
      x[j] = buffer->first_real_part_outputs_[j][i];
      y[j] = buffer->first_imag_part_outputs_[j][i];
    }
    if (!inverse_fast_fourier_transform_.Run(
            buffer->real_part_input_, buffer->imag_part_input_,
            &buffer->second_real_part_outputs_[i],
            &buffer->second_imag_part_outputs_[i])) {
      return false;
    }
  }

  // Save results.
  for (int i(0); i < fft_length_; ++i) {
    std::copy(buffer->second_real_part_outputs_[i].begin(),
              buffer->second_real_part_outputs_[i].end(),
              (*real_part_output)[i]);
    std::copy(buffer->second_imag_part_outputs_[i].begin(),
              buffer->second_imag_part_outputs_[i].end(),
              (*imag_part_output)[i]);
  }

  return true;
}